

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool jsonip::parser::
     seq_<jsonip::parser::char_<(char)102>,jsonip::parser::char_<(char)97>,jsonip::parser::char_<(char)108>,jsonip::parser::char_<(char)115>,jsonip::parser::char_<(char)101>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state)

{
  pointer *ppSVar1;
  iterator __position;
  istream *piVar2;
  char cVar3;
  bool bVar4;
  pointer pSVar5;
  undefined1 auVar6 [16];
  undefined1 auStack_28 [8];
  State cur_state;
  
  auVar6 = std::istream::tellg();
  cur_state._0_8_ = auVar6._8_8_;
  auStack_28 = auVar6._0_8_;
  cur_state._8_8_ = state->line_;
  __position._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State>>
                *)&state->stack_,__position,(State *)auStack_28);
    auVar6._8_8_ = cur_state._0_8_;
    auVar6._0_8_ = auStack_28;
  }
  else {
    (__position._M_current)->line_ = cur_state._8_8_;
    (__position._M_current)->pos_ = (PositionType)auVar6[0];
    *(long *)&(__position._M_current)->field_0x1 = auVar6._1_8_;
    *(int7 *)&(__position._M_current)->field_0x9 = auVar6._9_7_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  cur_state._0_8_ = auVar6._8_8_;
  auStack_28 = auVar6._0_8_;
  piVar2 = state->reader_->in_;
  if (*(int *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20) == 0) {
    cVar3 = std::istream::peek();
    auVar6._8_8_ = cur_state._0_8_;
    auVar6._0_8_ = auStack_28;
    if (cVar3 == 'f') {
      std::istream::get();
      auVar6._8_8_ = cur_state._0_8_;
      auVar6._0_8_ = auStack_28;
      piVar2 = state->reader_->in_;
      if (*(int *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20) == 0) {
        cVar3 = std::istream::peek();
        auVar6._8_8_ = cur_state._0_8_;
        auVar6._0_8_ = auStack_28;
        if (cVar3 == 'a') {
          std::istream::get();
          auVar6._8_8_ = cur_state._0_8_;
          auVar6._0_8_ = auStack_28;
          piVar2 = state->reader_->in_;
          if (*(int *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20) == 0) {
            cVar3 = std::istream::peek();
            auVar6._8_8_ = cur_state._0_8_;
            auVar6._0_8_ = auStack_28;
            if (cVar3 == 'l') {
              std::istream::get();
              auVar6._8_8_ = cur_state._0_8_;
              auVar6._0_8_ = auStack_28;
              piVar2 = state->reader_->in_;
              if (*(int *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20) == 0) {
                cVar3 = std::istream::peek();
                auVar6._8_8_ = cur_state._0_8_;
                auVar6._0_8_ = auStack_28;
                if (cVar3 == 's') {
                  std::istream::get();
                  auVar6._8_8_ = cur_state._0_8_;
                  auVar6._0_8_ = auStack_28;
                  piVar2 = state->reader_->in_;
                  if (*(int *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20) == 0) {
                    cVar3 = std::istream::peek();
                    auVar6._8_8_ = cur_state._0_8_;
                    auVar6._0_8_ = auStack_28;
                    if (cVar3 == 'e') {
                      std::istream::get();
                      auVar6 = std::istream::tellg();
                      if (*(long *)&state->max_pos_ < auVar6._0_8_) {
                        state->max_pos_ = (PositionType)auVar6[0];
                        *(long *)&state->field_0x29 = auVar6._1_8_;
                        *(int7 *)&state->field_0x31 = auVar6._9_7_;
                      }
                      pSVar5 = (state->stack_).
                               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      bVar4 = true;
                      goto LAB_00112d5d;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  cur_state._0_8_ = auVar6._8_8_;
  auStack_28 = auVar6._0_8_;
  auVar6 = std::istream::tellg();
  if (*(long *)&state->max_pos_ < auVar6._0_8_) {
    state->max_pos_ = (PositionType)auVar6[0];
    *(long *)&state->field_0x29 = auVar6._1_8_;
    *(int7 *)&state->field_0x31 = auVar6._9_7_;
  }
  pSVar5 = (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::istream::seekg(state->reader_->in_,*(undefined8 *)(pSVar5 + -1),
                      *(undefined8 *)&pSVar5[-1].field_0x8);
  pSVar5 = (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  state->line_ = pSVar5[-1].line_;
  bVar4 = false;
LAB_00112d5d:
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar5 + -1;
  return bVar4;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) && C1::match(state) &&
                       C2::match(state) && C3::match(state) &&
                       C4::match(state) && C5::match(state) &&
                       C6::match(state) && C7::match(state);
            var ? state.commit() : state.rollback();

            return var;
        }